

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
pegmatite::Context::parse_rule(Context *this,Rule *r,offset_in_Context_to_subr parse_func)

{
  pointer *ppRVar1;
  unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
  *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer pRVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  _Hash_node_base _Var7;
  _Hash_node_base *p_Var8;
  const_iterator __position;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  __last;
  Rule *pRVar9;
  Input *pIVar10;
  Index IVar11;
  Index IVar12;
  char cVar13;
  mapped_type *this_01;
  __node_ptr p_Var14;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var15;
  long in_RCX;
  ParseMatch *__cur;
  ulong uVar16;
  undefined8 *puVar17;
  size_type __n;
  ulong uVar18;
  bool bVar19;
  pointer pPVar20;
  _Hash_node_base _Var21;
  ulong uVar22;
  long *plVar23;
  ulong __c;
  MatchMode MVar24;
  long lVar25;
  undefined1 auVar26 [16];
  __buckets_alloc_type __alloc;
  pointer local_90;
  vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  local_68;
  ParserPosition *local_50;
  CacheKey k;
  
  k.rule = r;
  this_01 = std::__detail::
            _Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->rule_states,&k.rule);
  pRVar4 = (this_01->
           super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((this_01->
      super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
      )._M_impl.super__Vector_impl_data._M_start == pRVar4) {
    local_90 = (pointer)0xffffffffffffffff;
    MVar24 = PARSE;
  }
  else {
    local_90 = (pointer)pRVar4[-1].position;
    MVar24 = pRVar4[-1].mode;
  }
  local_50 = &this->position;
  pPVar20 = (pointer)((this->position).it.idx - (this->start).idx);
  k.start.buffer = (this->position).it.buffer;
  k.start.idx = (this->position).it.idx;
  this_00 = &this->cache;
  uVar22 = k.start.idx * 2 ^ (ulong)r;
  uVar16 = uVar22 % (this->cache)._M_h._M_bucket_count;
  k.rule = r;
  p_Var14 = std::
            _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_node(&this_00->_M_h,uVar16,&k,uVar22);
  if (p_Var14 != (__node_ptr)0x0) {
    lVar25 = *(long *)((long)&(p_Var14->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x38) -
             *(long *)((long)&(p_Var14->
                              super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                              ._M_storage._M_storage + 0x30);
    local_68.
    super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
    ._M_impl.super__Vector_impl_data._M_start =
         std::
         _Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ::_M_allocate((_Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                        *)(lVar25 / 0x38),uVar16);
    local_68.
    super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(lVar25 + (long)local_68.
                                  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    puVar5 = *(undefined8 **)
              ((long)&(p_Var14->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x38);
    local_68.
    super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ._M_impl.super__Vector_impl_data._M_start;
    for (puVar17 = *(undefined8 **)
                    ((long)&(p_Var14->
                            super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                            ._M_storage._M_storage + 0x30); puVar17 != puVar5; puVar17 = puVar17 + 7
        ) {
      uVar6 = puVar17[6];
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).finish.line = (int)uVar6;
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).finish.col =
           (int)((ulong)uVar6 >> 0x20);
      pRVar9 = (Rule *)*puVar17;
      pIVar10 = (Input *)puVar17[1];
      IVar11 = puVar17[2];
      uVar6 = puVar17[3];
      IVar12 = puVar17[5];
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).finish.it.buffer = (Input *)puVar17[4];
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).finish.it.idx = IVar12;
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).start.it.idx = IVar11;
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).start.line = (int)uVar6;
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).start.col = (int)((ulong)uVar6 >> 0x20)
      ;
      (local_68.
       super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
       ._M_impl.super__Vector_impl_data._M_finish)->matched_rule = pRVar9;
      ((local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish)->source).start.it.buffer = pIVar10;
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_68.
           super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
    ::
    insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
              ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                *)&this->matches,
               (this->matches).
               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                )local_68.
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                )local_68.
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    uVar6 = *(undefined8 *)
             ((long)&(p_Var14->
                     super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                     ._M_storage._M_storage + 0x28);
    local_50->line = (int)uVar6;
    local_50->col = (int)((ulong)uVar6 >> 0x20);
    IVar11 = *(Index *)((long)&(p_Var14->
                               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                               ._M_storage._M_storage + 0x20);
    (local_50->it).buffer =
         *(Input **)
          ((long)&(p_Var14->
                  super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                  ._M_storage._M_storage + 0x18);
    (local_50->it).idx = IVar11;
    std::
    vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>::
    ~vector(&local_68);
    return true;
  }
  uVar16 = (long)(this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matches).
                 super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (MVar24 == REJECT) {
    if (pPVar20 != local_90) {
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_68.
                            super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_start = pPVar20;
      std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
      emplace_back<pegmatite::Context::RuleState>(this_01,(RuleState *)&local_68);
      goto LAB_001381af;
    }
LAB_00138340:
    bVar19 = false;
  }
  else {
    if (MVar24 == PARSE) {
      if (pPVar20 == local_90) {
        local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = local_90;
        local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_68.
                               super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
      }
      else {
        local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_68.
                              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        local_68.
        super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar20;
      }
      std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
      emplace_back<pegmatite::Context::RuleState>(this_01,(RuleState *)&local_68);
LAB_001381af:
      plVar23 = (long *)((long)&this->whitespace_rule + in_RCX);
      if ((parse_func & 1) != 0) {
        parse_func = *(undefined8 *)(*plVar23 + -1 + parse_func);
      }
      cVar13 = (*(code *)parse_func)(plVar23,r);
      ppRVar1 = &(this_01->
                 super__Vector_base<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + -1;
      if (cVar13 == '\0') goto LAB_00138340;
    }
    if (0x100 < (this->cache)._M_h._M_element_count) {
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&this_00->_M_h);
    }
    __c = k.start.idx * 2 ^ (ulong)k.rule;
    uVar22 = __c % (this->cache)._M_h._M_bucket_count;
    p_Var14 = std::
              _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_find_node(&this_00->_M_h,uVar22,&k,__c);
    if (p_Var14 == (__node_ptr)0x0) {
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
      p_Var14 = (__node_ptr)operator_new(0x58);
      (p_Var14->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
      (p_Var14->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).
      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
      ._M_storage._M_storage.__align = (anon_struct_8_0_00000001_for___align)k.rule;
      *(Input **)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 8) = k.start.buffer;
      *(Index *)((long)&(p_Var14->
                        super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                        ._M_storage._M_storage + 0x10) = k.start.idx;
      *(undefined8 *)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x20) = 0xffffffffffffffff;
      *(undefined8 *)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x30) = 0;
      *(undefined8 *)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x38) = 0;
      *(undefined8 *)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x40) = 0;
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var14;
      auVar26 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->cache)._M_h._M_rehash_policy,
                           (this->cache)._M_h._M_bucket_count,(this->cache)._M_h._M_element_count);
      __n = auVar26._8_8_;
      if ((auVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __s = (this_00->_M_h)._M_buckets;
      }
      else {
        if (__n == 1) {
          __s = &(this->cache)._M_h._M_single_bucket;
          (this->cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                          (&__alloc,__n);
          memset(__s,0,__n * 8);
        }
        p_Var2 = &(this->cache)._M_h._M_before_begin;
        _Var7._M_nxt = (this->cache)._M_h._M_before_begin._M_nxt;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        uVar22 = 0;
LAB_001382eb:
        _Var21._M_nxt = _Var7._M_nxt;
        uVar18 = uVar22;
        if (_Var21._M_nxt != (_Hash_node_base *)0x0) {
          _Var7._M_nxt = (_Var21._M_nxt)->_M_nxt;
          uVar22 = (ulong)_Var21._M_nxt[10]._M_nxt % __n;
          if (__s[uVar22] == (_Hash_node_base *)0x0) goto LAB_0013831c;
          (_Var21._M_nxt)->_M_nxt = __s[uVar22]->_M_nxt;
          pp_Var15 = &__s[uVar22]->_M_nxt;
          uVar22 = uVar18;
          goto LAB_0013833b;
        }
        std::
        _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_deallocate_buckets(&this_00->_M_h);
        (this->cache)._M_h._M_bucket_count = __n;
        (this->cache)._M_h._M_buckets = __s;
        uVar22 = __c % __n;
      }
      (p_Var14->
      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = __c;
      if (__s[uVar22] == (_Hash_node_base *)0x0) {
        p_Var8 = (this->cache)._M_h._M_before_begin._M_nxt;
        (p_Var14->super__Hash_node_base)._M_nxt = p_Var8;
        (this->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var14;
        if (p_Var8 != (_Hash_node_base *)0x0) {
          __s[(ulong)p_Var8[10]._M_nxt % (this->cache)._M_h._M_bucket_count] =
               (__node_base_ptr)p_Var14;
          __s = (this->cache)._M_h._M_buckets;
        }
        __s[uVar22] = &(this->cache)._M_h._M_before_begin;
      }
      else {
        (p_Var14->super__Hash_node_base)._M_nxt = __s[uVar22]->_M_nxt;
        __s[uVar22]->_M_nxt = (_Hash_node_base *)p_Var14;
      }
      psVar3 = &(this->cache)._M_h._M_element_count;
      *psVar3 = *psVar3 + 1;
      local_68.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_68);
    }
    *(undefined8 *)
     ((long)&(p_Var14->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x28) = *(undefined8 *)&local_50->line;
    IVar11 = (local_50->it).idx;
    *(Input **)
     ((long)&(p_Var14->
             super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
             ._M_storage._M_storage + 0x18) = (local_50->it).buffer;
    *(Index *)((long)&(p_Var14->
                      super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                      ._M_storage._M_storage + 0x20) = IVar11;
    __position._M_current =
         *(ParseMatch **)
          ((long)&(p_Var14->
                  super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                  ).
                  super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                  ._M_storage._M_storage + 0x30);
    if (*(ParseMatch **)
         ((long)&(p_Var14->
                 super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                 ._M_storage._M_storage + 0x38) != __position._M_current) {
      *(ParseMatch **)
       ((long)&(p_Var14->
               super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               ).
               super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
               ._M_storage._M_storage + 0x38) = __position._M_current;
    }
    pPVar20 = (this->matches).
              super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->matches).
         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    bVar19 = true;
    if (uVar16 < (ulong)((long)__last._M_current - (long)pPVar20)) {
      std::
      vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>::
      insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
                ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                  *)((p_Var14->
                     super__Hash_node_value<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>
                     ._M_storage._M_storage.__data + 0x30),__position,
                 (ParseMatch *)((long)pPVar20 + uVar16),__last);
    }
  }
  return bVar19;
LAB_0013831c:
  (_Var21._M_nxt)->_M_nxt = p_Var2->_M_nxt;
  p_Var2->_M_nxt = _Var21._M_nxt;
  __s[uVar22] = p_Var2;
  if ((_Var21._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var15 = __s + uVar18;
LAB_0013833b:
    *pp_Var15 = _Var21._M_nxt;
  }
  goto LAB_001382eb;
}

Assistant:

bool Context::parse_rule(const Rule &r, bool (Context::*parse_func)(const Rule &))
{
	// For each rule, we maintain a vector consisting of where it was last
	// encountered (in the input stream) and what the parsing mode was.
	auto &states = rule_states[std::addressof(r)];
	// If this is the first time that we've encountered this rule, then set the
	// last position and mode to values that will trigger a normal parse: We
	// can't be in left recursion if this is the first time that we've
	// encountered the rule.
	size_t last_pos = Input::npos;
	MatchMode last_mode = MatchMode::PARSE;
	if (!states.empty())
	{
		auto &last = states.back();
		last_pos = last.position;
		last_mode = last.mode;
	}
	// Return value (success or failure of parse)
	bool ok;

	// Compute the new position in the stream.  We're only tracking offsets to
	// detect left recursion, not storing iterators.
	size_t new_pos = position.it - start;

	// Check if we have left recursion.  We are in a left-recursive state if
	// the last time that we encountered this rule was at the same point in the
	// input.
	bool lr = new_pos == last_pos;

	// Look up the current rule and parser position in the cache to see if
	// we've been here before and successfully parsed the rule.
	CacheKey k = { std::addressof(r), position.it };
	auto cache_entry = cache.find(k);
	if (cache_entry != cache.end())
	{
		// If we have a cache entry then grab the list of matched rules and the
		// end parsing position from the cache and don't bother trying to apply
		// the rules again.
		auto cached_matches = cache_entry->second.second;
		matches.insert(matches.end(), cached_matches.begin(), cached_matches.end());
		position = cache_entry->second.first;
		return true;
	}

	size_t new_match_index = matches.size();

	switch (last_mode)
	{
		//normal parse
		case MatchMode::PARSE:
			if (lr)
			{
				//first try to parse the rule by rejecting it, so alternative
				//branches are examined
				states.push_back(RuleState(new_pos, MatchMode::REJECT));
				ok = (this->*parse_func)(r);
				states.pop_back();
				break;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
		case MatchMode::REJECT:
			if (lr)
			{
				ok = false;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
	}

	// If we successfully parsed the input, then cache the result.
	if (ok)
	{
		// To prevent the cache growing too large, if it starts to get quite
		// big, delete everything.  256is a mostly arbitrary number generated
		// by running a big(ish) parse with a few different values and finding
		// the place where the increase in memory didn't come with a noticeable
		// speedup.
		if (cache.size() > 256)
		{
			cache.clear();
		}
		// Insert the new cache entry
		auto &new_cache = cache[k];
		new_cache.first = position;
		auto &cached_matches = new_cache.second;
		cached_matches.clear();
		// If there some rules were matched, record them
		if (matches.size() > new_match_index)
		{
			const auto index =
				static_cast<Input::iterator::difference_type>(new_match_index);
			cached_matches.insert(cached_matches.begin(), matches.begin() +
					index, matches.end());
		}
	}

	return ok;
}